

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O3

void helper_tw_ppc64(CPUPPCState_conflict2 *env,target_ulong arg1,target_ulong arg2,uint32_t flags)

{
  _func_void_DisasContext_ptr_int_int **cpu;
  uint uVar1;
  ulong extraout_RDX;
  uint uVar2;
  bool bVar3;
  
  uVar2 = (uint)arg1;
  uVar1 = (uint)arg2;
  if ((((((int)uVar2 < (int)uVar1 & (byte)((flags & 0x10) >> 4)) == 0) &&
       (((int)uVar1 < (int)uVar2 & (byte)((flags & 8) >> 3)) == 0)) &&
      ((uVar2 == uVar1 & (byte)((flags & 4) >> 2)) == 0)) &&
     ((uVar2 < uVar1 & (byte)((flags & 2) >> 1)) == 0)) {
    bVar3 = (flags & 1) == 0;
    flags = (uint32_t)(bVar3 || uVar2 <= uVar1);
    if (bVar3 || uVar2 <= uVar1) {
      return;
    }
  }
  helper_tw_ppc64_cold_1();
  if (((((long)arg1 < (long)extraout_RDX & (byte)((flags & 0x10) >> 4)) == 0) &&
      (((long)extraout_RDX < (long)arg1 & (byte)((flags & 8) >> 3)) == 0)) &&
     (((arg1 == extraout_RDX & (byte)((flags & 4) >> 2)) == 0 &&
      (((arg1 < extraout_RDX & (byte)((flags & 2) >> 1)) == 0 &&
       ((flags & 1) == 0 || arg1 <= extraout_RDX)))))) {
    return;
  }
  helper_td_cold_1();
  cpu = &env[-1].spr_cb[0x1bf].oea_write;
  env->nip = (ulong)((uint)env->lr & 0xfffffffc);
  hreg_store_msr(env,(ulong)(ushort)env->ctr,1);
  (*cpu_interrupt_handler)((CPUState *)cpu,4);
  env->reserve_addr = 0xffffffffffffffff;
  if ((env->tlb_need_flush & 1) == 0) {
    return;
  }
  env->tlb_need_flush = env->tlb_need_flush & 0xfffffffe;
  tlb_flush_ppc64((CPUState *)cpu);
  return;
}

Assistant:

void helper_tw(CPUPPCState *env, target_ulong arg1, target_ulong arg2,
               uint32_t flags)
{
    if (!likely(!(((int32_t)arg1 < (int32_t)arg2 && (flags & 0x10)) ||
                  ((int32_t)arg1 > (int32_t)arg2 && (flags & 0x08)) ||
                  ((int32_t)arg1 == (int32_t)arg2 && (flags & 0x04)) ||
                  ((uint32_t)arg1 < (uint32_t)arg2 && (flags & 0x02)) ||
                  ((uint32_t)arg1 > (uint32_t)arg2 && (flags & 0x01))))) {
        raise_exception_err_ra(env, POWERPC_EXCP_PROGRAM,
                               POWERPC_EXCP_TRAP, GETPC());
    }
}